

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O1

void complex_multiply_add(float *dst,float *l,float *r,uint32_t size)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  
  if (size != 0) {
    uVar6 = 0;
    do {
      fVar2 = l[uVar6];
      uVar1 = uVar6 + 1;
      fVar3 = l[uVar1];
      fVar4 = r[uVar6];
      fVar5 = r[uVar1];
      dst[uVar6] = (fVar2 * fVar4 - fVar5 * fVar3) + dst[uVar6];
      dst[uVar1] = fVar2 * fVar5 + fVar3 * fVar4 + dst[uVar1];
      uVar6 = uVar6 + 2;
    } while (uVar6 < size);
  }
  return;
}

Assistant:

VECTORIZE void complex_multiply_add(float *restrict dst, float *restrict l, float *restrict r, uint32_t size){
  for(uint32_t k = 0; k < size; k+= 2){
    float reA = l[k+0];
    float imA = l[k+1];
    float reB = r[k+0];
    float imB = r[k+1];

    float re = reA * reB - imA * imB;
    float im = reA * imB + imA * reB;

    dst[k+0] += re;
    dst[k+1] += im;
  }
}